

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_color_pick(nk_context *ctx,nk_colorf *color,nk_color_format fmt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  float fVar7;
  nk_vec2 nVar5;
  undefined4 uVar8;
  undefined4 uVar9;
  nk_color right;
  nk_window *pnVar10;
  nk_panel *pnVar11;
  nk_user_font *pnVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  nk_widget_layout_states nVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  nk_color nVar20;
  void *pvVar21;
  undefined2 uVar22;
  nk_command_buffer *b;
  nk_flags *state;
  nk_context *i;
  long lVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar28;
  undefined1 auVar27 [16];
  undefined8 uVar29;
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  nk_rect r;
  nk_colorf nVar42;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  float V;
  nk_rect bounds;
  undefined8 local_158;
  float local_108;
  undefined8 local_d8;
  uint local_a8;
  nk_rect local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5fc7,
                  "int nk_color_pick(struct nk_context *, struct nk_colorf *, enum nk_color_format)"
                 );
  }
  if (color == (nk_colorf *)0x0) {
    __assert_fail("color",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5fc8,
                  "int nk_color_pick(struct nk_context *, struct nk_colorf *, enum nk_color_format)"
                 );
  }
  pnVar10 = ctx->current;
  if (pnVar10 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5fc9,
                  "int nk_color_pick(struct nk_context *, struct nk_colorf *, enum nk_color_format)"
                 );
  }
  pnVar11 = pnVar10->layout;
  if (pnVar11 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5fca,
                  "int nk_color_pick(struct nk_context *, struct nk_colorf *, enum nk_color_format)"
                 );
  }
  nVar15 = nk_widget(&local_58,ctx);
  if (nVar15 == NK_WIDGET_INVALID) {
    return 0;
  }
  i = (nk_context *)0x0;
  if ((nVar15 != NK_WIDGET_ROM) && ((pnVar11->flags & 0x1000) == 0)) {
    i = ctx;
  }
  pnVar12 = (ctx->style).font;
  if (pnVar12 == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5f9d,
                  "int nk_do_color_picker(nk_flags *, struct nk_command_buffer *, struct nk_colorf *, enum nk_color_format, struct nk_rect, struct nk_vec2, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  fVar39 = local_58.x;
  fVar40 = local_58.y;
  fVar26 = local_58.w;
  fVar38 = local_58.h;
  fVar35 = pnVar12->height;
  fVar31 = fVar35 + fVar35 + 0.0;
  uVar1 = color->r;
  uVar6 = color->g;
  uVar2 = color->b;
  fVar7 = color->a;
  fVar41 = (float)uVar2;
  fVar25 = (float)uVar6;
  if ((float)uVar2 <= (float)uVar6) {
    fVar41 = (float)uVar6;
    fVar25 = (float)uVar2;
  }
  fVar24 = fVar39 + 0.0;
  fVar28 = fVar40 + 0.0;
  fVar36 = fVar26 - fVar31;
  state = &ctx->last_widget_state;
  auVar14._4_8_ = (ulong)local_58._8_8_ >> 0x20;
  auVar14._0_4_ = fVar26 - fVar31;
  fVar31 = fVar41;
  local_48 = (float)uVar1;
  if (fVar41 <= (float)uVar1) {
    fVar31 = (float)uVar1;
    local_48 = fVar41;
  }
  fVar32 = fVar24 + fVar36;
  rect_00.h = fVar38;
  rect_00.w = fVar35;
  fVar37 = local_48;
  if (fVar25 <= local_48) {
    fVar37 = fVar25;
  }
  fVar37 = fVar31 - fVar37;
  uVar29 = auVar14._0_8_;
  fStack_44 = local_48;
  fStack_40 = local_48;
  fStack_3c = local_48;
  iVar16 = nk_button_behavior(state,(nk_rect)CONCAT88(uVar29,CONCAT44(fVar28,fVar24)),&i->input,
                              NK_BUTTON_REPEATER);
  if (iVar16 == 0) {
    local_108 = fVar37 / (fVar31 + 1e-20);
    iVar16 = 0;
  }
  else {
    auVar30._0_4_ = fVar36 + -1.0;
    auVar30._4_4_ = fVar38 + -1.0;
    auVar30._8_8_ = 0;
    nVar5 = (i->input).mouse.pos;
    auVar27._0_4_ = nVar5.x - fVar24;
    auVar27._4_4_ = nVar5.y - fVar28;
    auVar27._8_8_ = 0;
    auVar27 = divps(auVar27,auVar30);
    fVar34 = auVar27._4_4_;
    auVar13._4_4_ = -(uint)(0.0 < auVar27._0_4_);
    auVar13._0_4_ = -(uint)(0.0 < fVar34);
    auVar13._8_4_ = -(uint)(1.0 < fVar34);
    auVar13._12_4_ = -(uint)(1.0 < auVar27._0_4_);
    uVar17 = movmskps(iVar16,auVar13);
    fVar33 = 1.0;
    if ((uVar17 & 1) == 0) {
      fVar33 = 0.0;
    }
    fVar31 = 1.0;
    if ((uVar17 & 4) == 0) {
      fVar31 = fVar33;
    }
    if ((uVar17 & 1) == 0) {
      fVar34 = fVar31;
    }
    if ((uVar17 & 4) == 0) {
      fVar31 = fVar34;
    }
    local_108 = 1.0;
    if ((uVar17 & 10) == 0) {
      local_108 = 0.0;
    }
    if ((uVar17 & 2) == 0) {
      auVar27 = ZEXT416((uint)local_108);
    }
    if ((uVar17 & 8) == 0) {
      local_108 = auVar27._0_4_;
    }
    fVar31 = 1.0 - fVar31;
    iVar16 = 1;
  }
  r.x = fVar35 + fVar32;
  iVar18 = nk_button_behavior(state,(nk_rect)CONCAT88(CONCAT44(fVar38,fVar35),
                                                      CONCAT44(fVar28,fVar24 + fVar36)),&i->input,
                              NK_BUTTON_REPEATER);
  if (iVar18 == 0) {
    fVar34 = (float)(-(uint)((float)uVar6 < (float)uVar2) & 0xbf800000);
    fVar25 = (local_48 - fVar25) / (fVar37 * 6.0 + 1e-20) +
             (float)(~-(uint)((float)uVar1 < fVar41) & (uint)fVar34 |
                    (uint)(-0.33333334 - fVar34) & -(uint)((float)uVar1 < fVar41));
    fVar41 = -fVar25;
    if (-fVar25 <= fVar25) {
      fVar41 = fVar25;
    }
  }
  else {
    fVar41 = ((i->input).mouse.pos.y - fVar28) / (fVar38 + -1.0);
    fVar25 = 1.0;
    if (fVar41 <= 1.0) {
      fVar25 = (float)(-(uint)(0.0 < fVar41) & 0x3f800000);
    }
    iVar16 = 1;
    if (1.0 < fVar41 || fVar41 <= 0.0) {
      fVar41 = fVar25;
    }
  }
  iVar18 = iVar16;
  if ((fmt == NK_RGBA) &&
     (r.y = fVar28, r.w = fVar35, r.h = fVar38,
     iVar19 = nk_button_behavior(state,r,&i->input,NK_BUTTON_REPEATER), iVar19 != 0)) {
    fVar37 = ((i->input).mouse.pos.y - fVar28) / (fVar38 + -1.0);
    fVar7 = (float)(-(uint)(1.0 < fVar37) & 0x3f800000 |
                   ~-(uint)(1.0 < fVar37) & -(uint)(0.0 < fVar37) & 0x3f800000);
    fVar25 = fVar37;
    if (fVar37 <= 0.0) {
      fVar25 = fVar7;
    }
    if (fVar37 <= 1.0) {
      fVar7 = fVar25;
    }
    fVar7 = 1.0 - fVar7;
    iVar18 = 1;
  }
  uVar17 = *state & 2 | 4;
  *state = uVar17;
  if (iVar16 != 0) {
    nVar42 = nk_hsva_colorf(fVar41,local_108,fVar31,fVar7);
    *color = nVar42;
    *state = 0x22;
    uVar17 = 0x22;
  }
  if (iVar18 != 0) {
    color->a = fVar7;
    *state = 0x22;
    uVar17 = 0x22;
  }
  if (i == (nk_context *)0x0) goto LAB_0012fa8f;
  fVar7 = (i->input).mouse.pos.x;
  fVar26 = fVar26 + fVar24;
  if ((((fVar7 < fVar39) || (fVar26 <= fVar7)) || (fVar7 = (i->input).mouse.pos.y, fVar7 < fVar40))
     || (fVar38 + fVar28 <= fVar7)) {
    fVar7 = (i->input).mouse.prev.x;
LAB_0012fa52:
    if (((fVar7 < fVar39) || (fVar26 <= fVar7)) ||
       ((fVar7 = (i->input).mouse.prev.y, fVar7 < fVar40 || (fVar38 + fVar28 <= fVar7))))
    goto LAB_0012fa8f;
    uVar17 = uVar17 | 0x40;
  }
  else {
    *state = 0x12;
    uVar17 = 0x12;
    fVar7 = (i->input).mouse.prev.x;
    if (((fVar39 <= fVar7) && (fVar7 < fVar26)) &&
       ((fVar41 = (i->input).mouse.prev.y, fVar40 <= fVar41 && (fVar41 < fVar38 + fVar28))))
    goto LAB_0012fa52;
    uVar17 = 0x1a;
  }
  *state = uVar17;
LAB_0012fa8f:
  uVar3 = color->r;
  uVar8 = color->g;
  uVar4 = color->b;
  uVar9 = color->a;
  fVar7 = (float)uVar4;
  fVar41 = (float)uVar8;
  if ((float)uVar4 <= (float)uVar8) {
    fVar7 = (float)uVar8;
    fVar41 = (float)uVar4;
  }
  fVar25 = fVar7;
  fVar26 = (float)uVar3;
  if (fVar7 <= (float)uVar3) {
    fVar25 = (float)uVar3;
    fVar26 = fVar7;
  }
  b = &pnVar10->buffer;
  local_a8 = -(uint)((float)uVar8 < (float)uVar4) & 0xbf800000;
  fVar31 = fVar26;
  if (fVar41 <= fVar26) {
    fVar31 = fVar41;
  }
  nVar20.r = 0xff;
  nVar20.g = '\0';
  nVar20.b = '\0';
  nVar20.a = 0xff;
  lVar23 = 0;
  do {
    iVar16 = (int)lVar23;
    right = *(nk_color *)(nk_draw_color_picker_hue_colors + lVar23 * 4 + 4);
    lVar23 = lVar23 + 1;
    rect.y = (float)iVar16 * (fVar38 / 6.0) + fVar28 + 0.5;
    rect.x = fVar32;
    rect.w = fVar35;
    rect.h = fVar38 / 6.0 + 0.5;
    nk_fill_rect_multi_color(b,rect,nVar20,nVar20,right,right);
    nVar20 = right;
  } while (lVar23 != 6);
  fVar41 = (float)(~-(uint)((float)uVar3 < fVar7) & local_a8 |
                  (uint)(-0.33333334 - (float)(-(uint)((float)uVar8 < (float)uVar4) & 0xbf800000)) &
                  -(uint)((float)uVar3 < fVar7)) +
           (fVar26 - fVar41) / ((fVar25 - fVar31) * 6.0 + 1e-20);
  fVar7 = -fVar41;
  if (-fVar41 <= fVar41) {
    fVar7 = fVar41;
  }
  pvVar21 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
  if (pvVar21 != (void *)0x0) {
    *(undefined2 *)((long)pvVar21 + 0x10) = 1;
    *(short *)((long)pvVar21 + 0x12) = (short)(int)(fVar32 + -1.0);
    uVar22 = (undefined2)(int)(fVar7 * fVar38 + fVar28 + 0.5);
    *(undefined2 *)((long)pvVar21 + 0x14) = uVar22;
    *(short *)((long)pvVar21 + 0x16) = (short)(int)(r.x + 2.0);
    *(undefined2 *)((long)pvVar21 + 0x18) = uVar22;
    *(undefined4 *)((long)pvVar21 + 0x1a) = 0xffffffff;
  }
  if (fmt == NK_RGBA) {
    rect_00.x = r.x;
    rect_00.y = fVar28;
    nk_fill_rect_multi_color
              (b,rect_00,(nk_color)0xffffffff,(nk_color)0xffffffff,(nk_color)0xff000000,
               (nk_color)0xff000000);
    pvVar21 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
    if (pvVar21 != (void *)0x0) {
      fVar41 = 1.0;
      if ((float)uVar9 <= 1.0) {
        fVar41 = (float)uVar9;
      }
      if (fVar41 <= 0.0) {
        fVar41 = 0.0;
      }
      *(undefined2 *)((long)pvVar21 + 0x10) = 1;
      *(short *)((long)pvVar21 + 0x12) = (short)(int)(r.x + -1.0);
      uVar22 = (undefined2)(int)((1.0 - fVar41) * fVar38 + fVar28 + 0.5);
      *(undefined2 *)((long)pvVar21 + 0x14) = uVar22;
      *(short *)((long)pvVar21 + 0x16) = (short)(int)(fVar35 + r.x + 2.0);
      *(undefined2 *)((long)pvVar21 + 0x18) = uVar22;
      *(undefined4 *)((long)pvVar21 + 0x1a) = 0xffffffff;
    }
  }
  fVar7 = fVar7 / 0.16666667;
  fVar26 = 1.0 - (fVar7 - (float)(int)fVar7);
  fVar41 = 1.0 - fVar26;
  fVar35 = 0.0;
  switch((int)fVar7) {
  case 1:
    fVar39 = 1.0;
    fVar7 = fVar26;
    break;
  case 2:
    fVar39 = 1.0;
    fVar35 = fVar41;
    fVar7 = 0.0;
    break;
  case 3:
    fVar35 = 1.0;
    fVar7 = 0.0;
    fVar39 = fVar26;
    break;
  case 4:
    fVar35 = 1.0;
    fVar7 = fVar41;
    fVar39 = 0.0;
    break;
  case 5:
    fVar35 = fVar26;
    fVar7 = 1.0;
    fVar39 = 0.0;
    break;
  default:
    fVar7 = 1.0;
    fVar39 = fVar41;
  }
  nVar20 = nk_rgba_f(fVar7,fVar39,fVar35,1.0);
  rect_01.w = (float)(int)uVar29;
  rect_01.h = (float)(int)((ulong)uVar29 >> 0x20);
  rect_01.x = fVar24;
  rect_01.y = fVar28;
  nk_fill_rect_multi_color(b,rect_01,(nk_color)0xffffffff,nVar20,nVar20,(nk_color)0xffffffff);
  rect_02.w = (float)(int)uVar29;
  rect_02.h = (float)(int)((ulong)uVar29 >> 0x20);
  rect_02.x = fVar24;
  rect_02.y = fVar28;
  nk_fill_rect_multi_color
            (b,rect_02,(nk_color)0x0,(nk_color)0x0,(nk_color)0xff000000,(nk_color)0xff000000);
  fVar24 = ((fVar25 - fVar31) / (fVar25 + 1e-20)) * fVar36 + fVar24;
  fVar35 = (float)(int)fVar24;
  fVar28 = (1.0 - fVar25) * fVar38 + fVar28;
  pvVar21 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
  uVar22 = (undefined2)(int)fVar28;
  if (pvVar21 != (void *)0x0) {
    *(undefined2 *)((long)pvVar21 + 0x10) = 1;
    *(short *)((long)pvVar21 + 0x12) = (short)(int)(fVar35 + -7.0);
    *(undefined2 *)((long)pvVar21 + 0x14) = uVar22;
    *(short *)((long)pvVar21 + 0x16) = (short)(int)(fVar35 + -2.0);
    *(undefined2 *)((long)pvVar21 + 0x18) = uVar22;
    *(undefined4 *)((long)pvVar21 + 0x1a) = 0xffffffff;
  }
  fVar7 = (float)(int)fVar28;
  pvVar21 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
  if (pvVar21 != (void *)0x0) {
    *(undefined2 *)((long)pvVar21 + 0x10) = 1;
    *(short *)((long)pvVar21 + 0x12) = (short)(int)(fVar35 + 7.0 + 1.0);
    *(undefined2 *)((long)pvVar21 + 0x14) = uVar22;
    *(short *)((long)pvVar21 + 0x16) = (short)(int)(fVar35 + 3.0);
    *(undefined2 *)((long)pvVar21 + 0x18) = uVar22;
    *(undefined4 *)((long)pvVar21 + 0x1a) = 0xffffffff;
  }
  pvVar21 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
  uVar22 = (undefined2)(int)fVar24;
  if (pvVar21 != (void *)0x0) {
    *(undefined2 *)((long)pvVar21 + 0x10) = 1;
    *(undefined2 *)((long)pvVar21 + 0x12) = uVar22;
    *(short *)((long)pvVar21 + 0x14) = (short)(int)(fVar7 + 7.0 + 1.0);
    *(undefined2 *)((long)pvVar21 + 0x16) = uVar22;
    *(short *)((long)pvVar21 + 0x18) = (short)(int)(fVar7 + 3.0);
    *(undefined4 *)((long)pvVar21 + 0x1a) = 0xffffffff;
  }
  pvVar21 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
  if (pvVar21 != (void *)0x0) {
    *(undefined2 *)((long)pvVar21 + 0x10) = 1;
    *(undefined2 *)((long)pvVar21 + 0x12) = uVar22;
    *(short *)((long)pvVar21 + 0x14) = (short)(int)(fVar7 + -7.0);
    *(undefined2 *)((long)pvVar21 + 0x16) = uVar22;
    *(short *)((long)pvVar21 + 0x18) = (short)(int)(fVar7 + -2.0);
    *(undefined4 *)((long)pvVar21 + 0x1a) = 0xffffffff;
  }
  return iVar18;
}

Assistant:

NK_API int
nk_color_pick(struct nk_context * ctx, struct nk_colorf *color,
    enum nk_color_format fmt)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *config;
    const struct nk_input *in;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(color);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !color)
        return 0;

    win = ctx->current;
    config = &ctx->style;
    layout = win->layout;
    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_color_picker(&ctx->last_widget_state, &win->buffer, color, fmt, bounds,
                nk_vec2(0,0), in, config->font);
}